

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

bool __thiscall
glslang::HlslParseContext::shouldFlatten
          (HlslParseContext *this,TType *type,TStorageQualifier qualifier,bool topLevel)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  byte local_3b;
  byte local_3a;
  byte local_39;
  bool topLevel_local;
  TStorageQualifier qualifier_local;
  TType *type_local;
  HlslParseContext *this_local;
  
  if (qualifier - EvqVaryingIn < 2) {
    uVar2 = (*type->_vptr_TType[0x25])();
    local_39 = 1;
    if ((uVar2 & 1) == 0) {
      iVar3 = (*type->_vptr_TType[0x1d])();
      local_39 = (byte)iVar3;
    }
    this_local._7_1_ = (bool)(local_39 & 1);
  }
  else if (qualifier == EvqUniform) {
    uVar2 = (*type->_vptr_TType[0x1d])();
    if ((((uVar2 & 1) == 0) ||
        (bVar1 = TIntermediate::getFlattenUniformArrays
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate),
        !bVar1)) || (local_3a = 1, !topLevel)) {
      uVar2 = (*type->_vptr_TType[0x25])();
      local_3b = 0;
      if ((uVar2 & 1) != 0) {
        iVar3 = (*type->_vptr_TType[0x36])();
        local_3b = (byte)iVar3;
      }
      local_3a = local_3b;
    }
    this_local._7_1_ = (bool)(local_3a & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslParseContext::shouldFlatten(const TType& type, TStorageQualifier qualifier, bool topLevel) const
{
    switch (qualifier) {
    case EvqVaryingIn:
    case EvqVaryingOut:
        return type.isStruct() || type.isArray();
    case EvqUniform:
        return (type.isArray() && intermediate.getFlattenUniformArrays() && topLevel) ||
               (type.isStruct() && type.containsOpaque());
    default:
        return false;
    };
}